

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O1

int __thiscall Encode::calcMedian(Encode *this,int left,int right)

{
  double dVar1;
  pointer pdVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  
  lVar4 = (long)right;
  pdVar2 = (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar2[lVar4];
  dVar3 = 0.0;
  if (left < right) {
    lVar6 = (long)left;
    dVar3 = 0.0;
    do {
      dVar3 = dVar3 + pdVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  if (dVar1 <= dVar3) {
    pdVar5 = pdVar2 + lVar4;
    do {
      pdVar5 = pdVar5 + -1;
      dVar3 = dVar3 - *pdVar5;
      dVar1 = *pdVar5 + dVar1;
      right = right + -1;
    } while (dVar1 <= dVar3);
  }
  return right;
}

Assistant:

int calcMedian(int left, int right) {
        long double sumLeft = 0, sumRight = m_probabilities[right];
        unsigned long median;
        for (int i = left; i < right; ++i) {
            sumLeft += m_probabilities[i];
        }
        median = right;
        while (sumLeft >= sumRight) {
            --median;
            sumLeft -= m_probabilities[median];
            sumRight += m_probabilities[median];
        }
        return (int) median;
    }